

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

_Bool prefix(char *s,char *t)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    cVar2 = t[lVar3];
    if (cVar2 == '\0') break;
    pcVar1 = s + lVar3;
    lVar3 = lVar3 + 1;
  } while (cVar2 == *pcVar1);
  return cVar2 == '\0';
}

Assistant:

bool prefix(const char *s, const char *t)
{
	/* Scan "t" */
	while (*t)
	{
		/* Compare content and length */
		if (*t++ != *s++) return (false);
	}

	/* Matched, we have a prefix */
	return (true);
}